

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Texture2DGenMipmapCase::iterate(Texture2DGenMipmapCase *this)

{
  int i;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  qpTestResult testResult;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_02;
  TextureFormat *pTVar6;
  ChannelOrder CVar7;
  TextureFormat *pTVar8;
  char *description;
  ulong uVar9;
  uint uVar10;
  int preferredWidth;
  uint uVar11;
  int preferredHeight;
  TextureFormat *format;
  BVec4 formatMask;
  RandomViewport viewport;
  IVec4 framebufferBits;
  vector<float,_std::allocator<float>_> texCoord;
  IVec4 cmpBits;
  IVec4 formatBits;
  Texture2D resultTexture;
  char local_11c [4];
  GenMipmapPrecision local_118;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  vector<float,_std::allocator<float>_> local_e8;
  IVec4 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  TextureRenderer *local_a0;
  long local_98;
  tcu local_90 [16];
  Texture2D local_80;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_98 = CONCAT44(extraout_var,iVar1);
  uVar10 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar10 = this->m_width;
  }
  if (uVar10 == 0) {
    uVar11 = 0x20;
  }
  else {
    uVar11 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    uVar11 = uVar11 ^ 0x1f;
  }
  local_118.filterBits.m_data[0] = RGBA;
  local_118.filterBits.m_data[1] = UNORM_INT8;
  tcu::Texture2D::Texture2D
            (&local_80,(TextureFormat *)&local_118,(this->m_texture->m_refTexture).m_width,
             (this->m_texture->m_refTexture).m_height);
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,0);
  local_118.filterBits.m_data[0] = 0x3f800000;
  local_118.filterBits.m_data[1] = 0x3f000000;
  local_118.filterBits.m_data[2] = 0;
  local_118.colorThreshold.m_data[0] = 0.5;
  local_f8._0_4_ = R;
  local_f8._4_4_ = SNORM_INT8;
  uStack_f0 = &DAT_3f8000003f800000;
  tcu::fillWithGrid((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,8,(Vec4 *)&local_118,(Vec4 *)local_f8)
  ;
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(local_98 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(local_98 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(local_98 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(local_98 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(local_98 + 0x1360))(0xde1,0x2800,0x2600);
  dVar2 = (**(code **)(local_98 + 0x800))();
  glu::checkError(dVar2,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x345);
  (**(code **)(local_98 + 0xc18))(0x8192,this->m_hint);
  (**(code **)(local_98 + 0x710))(0xde1);
  dVar2 = (**(code **)(local_98 + 0x800))();
  glu::checkError(dVar2,"glGenerateMipmap()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureMipmapTests.cpp"
                  ,0x34a);
  local_118.filterBits.m_data[0] = R;
  local_118.filterBits.m_data[1] = SNORM_INT8;
  local_f8 = (undefined1  [8])&DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_e8,(Vec2 *)&local_118,(Vec2 *)local_f8);
  if (uVar10 != 0) {
    local_a0 = &this->m_renderer;
    uVar9 = 0;
    uVar4 = (ulong)(0x1f - uVar11);
    if ((int)(0x1f - uVar11) < 1) {
      uVar4 = uVar9;
    }
    local_a8 = uVar4 * 0x28 + 0x28;
    iVar1 = 0;
    do {
      preferredWidth = this->m_width >> ((byte)iVar1 & 0x1f);
      if (preferredWidth < 2) {
        preferredWidth = 1;
      }
      preferredHeight = this->m_height >> ((byte)iVar1 & 0x1f);
      if (preferredHeight < 2) {
        preferredHeight = 1;
      }
      iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
      dVar2 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
      deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
                ((RandomViewport *)&local_118,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),
                 preferredWidth,preferredHeight,dVar2 + iVar1);
      (**(code **)(local_98 + 0x1a00))
                (local_118.filterBits.m_data._0_8_ & 0xffffffff,local_118.filterBits.m_data[1],
                 local_118.filterBits.m_data[2]);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (local_a0,0,
                 local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,TEXTURETYPE_2D);
      tcu::Texture2D::allocLevel(&local_80,iVar1);
      glu::readPixels(this->m_renderCtx,local_118.filterBits.m_data[0],
                      local_118.filterBits.m_data[1],
                      (PixelBufferAccess *)
                      ((long)((local_80.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess).m_size.m_data + (uVar9 - 8)));
      iVar1 = iVar1 + 1;
      uVar9 = uVar9 + 0x28;
    } while (local_a8 != uVar9);
  }
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_b8 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 8);
  uStack_b0 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar1) + 0x10);
  local_118.filterBits.m_data[0] = R;
  local_118.filterBits.m_data[1] = SNORM_INT8;
  local_118.filterBits.m_data[2] = 0;
  local_118.colorThreshold.m_data[0] = 0.0;
  lVar5 = 0;
  do {
    (&((TextureFormat *)&local_118)->order)[lVar5] = *(int *)((long)&local_b8 + lVar5 * 4) - I;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_c8.m_data[0] = 0;
  local_c8.m_data[1] = 0;
  local_c8.m_data[2] = 0;
  local_c8.m_data[3] = 0;
  local_f8._0_4_ = R;
  local_f8._4_4_ = SNORM_INT8;
  uStack_f0._0_4_ = 0.0;
  uStack_f0._4_4_ = 0.0;
  lVar5 = 0;
  do {
    CVar7 = local_c8.m_data[lVar5];
    if (local_c8.m_data[lVar5] < (int)(&((TextureFormat *)&local_118)->order)[lVar5]) {
      CVar7 = (&((TextureFormat *)&local_118)->order)[lVar5];
    }
    *(ChannelOrder *)(local_f8 + lVar5 * 4) = CVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_118.filterBits.m_data._0_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  format = (TextureFormat *)&local_118;
  tcu::getTextureFormatBitDepth((tcu *)&local_b8,format);
  local_118.filterBits.m_data[0] = R;
  local_118.filterBits.m_data[1] = SNORM_INT8;
  local_118.filterBits.m_data[2] = 0;
  local_118.colorThreshold.m_data[0] = 0.0;
  local_11c[0] = '\0';
  local_11c[1] = '\0';
  local_11c[2] = '\0';
  local_11c[3] = '\0';
  lVar5 = 0;
  do {
    local_11c[lVar5] =
         (int)(&((TextureFormat *)&local_118)->order)[lVar5] < *(int *)((long)&local_b8 + lVar5 * 4)
    ;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_118.filterBits.m_data[0] = R;
  local_118.filterBits.m_data[1] = SNORM_INT8;
  local_118.filterBits.m_data[2] = 0;
  local_118.colorThreshold.m_data[0] = 0.0;
  lVar5 = 0;
  do {
    CVar7 = *(ChannelOrder *)((long)&local_b8 + lVar5 * 4);
    if ((int)*(ChannelOrder *)(local_f8 + lVar5 * 4) < (int)CVar7) {
      CVar7 = *(ChannelOrder *)(local_f8 + lVar5 * 4);
    }
    (&((TextureFormat *)&local_118)->order)[lVar5] = CVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_c8.m_data[0] = 0;
  local_c8.m_data[1] = 0;
  local_c8.m_data[2] = 0;
  local_c8.m_data[3] = 0;
  lVar5 = 0;
  pTVar8 = (TextureFormat *)local_f8;
  do {
    pTVar6 = pTVar8;
    if (local_11c[lVar5] != '\0') {
      pTVar6 = format;
    }
    local_c8.m_data[lVar5] = pTVar6->order;
    lVar5 = lVar5 + 1;
    pTVar8 = (TextureFormat *)&pTVar8->type;
    format = (TextureFormat *)&format->type;
  } while (lVar5 != 4);
  local_118.colorThreshold.m_data[1] = 0.0;
  local_118.colorThreshold.m_data[2] = 0.0;
  local_118.colorThreshold.m_data[3] = 0.0;
  local_118.colorMask.m_data[0] = false;
  local_118.colorMask.m_data[1] = false;
  local_118.colorMask.m_data[2] = false;
  local_118.colorMask.m_data[3] = false;
  local_118.filterBits.m_data[0] = R;
  local_118.filterBits.m_data[1] = SNORM_INT8;
  local_118.filterBits.m_data[2] = 0;
  local_118.colorThreshold.m_data[0] = 0.0;
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar5 = CONCAT44(extraout_var_02,iVar1);
  local_118.colorMask.m_data[1] = 0 < *(int *)(lVar5 + 0xc);
  local_118.colorMask.m_data[0] = 0 < *(int *)(lVar5 + 8);
  local_118.colorMask.m_data[2] = 0 < *(int *)(lVar5 + 0x10);
  local_118.colorMask.m_data[3] = 0 < *(int *)(lVar5 + 0x14);
  tcu::computeFixedPointThreshold(local_90,&local_c8);
  local_118.colorThreshold.m_data[0] = (float)local_90._0_8_;
  local_118.colorThreshold.m_data[1] = SUB84(local_90._0_8_,4);
  local_118.colorThreshold.m_data[2] = (float)local_90._8_8_;
  local_118.colorThreshold.m_data[3] = SUB84(local_90._8_8_,4);
  local_118.filterBits.m_data[0] = LA;
  local_118.filterBits.m_data[1] = UNORM_INT16;
  local_118.filterBits.m_data[2] = 0;
  testResult = glu::TextureTestUtil::compareGenMipmapResult
                         (((this->super_TestCase).super_TestNode.m_testCtx)->m_log,&local_80,
                          &this->m_texture->m_refTexture,&local_118);
  if (testResult == QP_TEST_RESULT_PASS) {
    description = "Pass";
  }
  else if (testResult == QP_TEST_RESULT_QUALITY_WARNING) {
    description = "Low-quality method used";
  }
  else {
    description = "";
    if (testResult == QP_TEST_RESULT_FAIL) {
      description = "Image comparison failed";
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
  if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&local_80);
  return STOP;
}

Assistant:

Texture2DGenMipmapCase::IterateResult Texture2DGenMipmapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();

	const deUint32			minFilter			= GL_NEAREST_MIPMAP_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;

	const int				numLevels			= deLog2Floor32(de::max(m_width, m_height))+1;

	tcu::Texture2D			resultTexture		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), m_texture->getRefTexture().getWidth(), m_texture->getRefTexture().getHeight());

	vector<float>			texCoord;

	// Initialize texture level 0 with colored grid.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 8, tcu::Vec4(1.0f, 0.5f, 0.0f, 0.5f), tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));

	// Upload data and setup params.
	m_texture->upload();

	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Generate mipmap.
	gl.hint(GL_GENERATE_MIPMAP_HINT, m_hint);
	gl.generateMipmap(GL_TEXTURE_2D);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap()");

	// Use (0, 0) -> (1, 1) texture coordinates.
	computeQuadTexCoord2D(texCoord, Vec2(0.0f, 0.0f), Vec2(1.0f, 1.0f));

	// Fetch resulting texture by rendering.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const int				levelWidth		= de::max(1, m_width >> levelNdx);
		const int				levelHeight		= de::max(1, m_height >> levelNdx);
		const RandomViewport	viewport		(m_renderCtx.getRenderTarget(), levelWidth, levelHeight, deStringHash(getName()) + levelNdx);

		gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
		m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_2D);

		resultTexture.allocLevel(levelNdx);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, resultTexture.getLevel(levelNdx));
	}

	// Compare results
	{

		const IVec4			framebufferBits		= max(getBitsVec(m_renderCtx.getRenderTarget().getPixelFormat())-2, IVec4(0));
		const IVec4			formatBits			= tcu::getTextureFormatBitDepth(glu::mapGLTransferFormat(m_format, m_dataType));
		const tcu::BVec4	formatMask			= greaterThan(formatBits, IVec4(0));
		const IVec4			cmpBits				= select(min(framebufferBits, formatBits), framebufferBits, formatMask);
		GenMipmapPrecision	comparePrec;

		comparePrec.colorMask		= getCompareMask(m_renderCtx.getRenderTarget().getPixelFormat());
		comparePrec.colorThreshold	= tcu::computeFixedPointThreshold(cmpBits);
		comparePrec.filterBits		= tcu::IVec3(4, 4, 0);

		const qpTestResult compareResult = compareGenMipmapResult(m_testCtx.getLog(), resultTexture, m_texture->getRefTexture(), comparePrec);

		m_testCtx.setTestResult(compareResult, compareResult == QP_TEST_RESULT_PASS				? "Pass" :
											   compareResult == QP_TEST_RESULT_QUALITY_WARNING	? "Low-quality method used"	:
											   compareResult == QP_TEST_RESULT_FAIL				? "Image comparison failed"	: "");
	}

	return STOP;
}